

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O1

ZyanStatus
ZydisFormatterBasePrintDecorator
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context,
          ZydisDecorator decorator)

{
  void **ppvVar1;
  ZyanU8 *pZVar2;
  ZydisRoundingMode ZVar3;
  ZydisMaskMode ZVar4;
  ZyanUSize ZVar5;
  ulong uVar6;
  void *pvVar7;
  ZyanStatus ZVar8;
  ZydisLetterCase letter_case;
  ZydisPredefinedTokenDECO_SAE_ *data;
  ZyanUSize ZVar9;
  ZydisShortString *source;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x24a,
                  "ZyanStatus ZydisFormatterBasePrintDecorator(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisDecorator)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x24b,
                  "ZyanStatus ZydisFormatterBasePrintDecorator(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisDecorator)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x24c,
                  "ZyanStatus ZydisFormatterBasePrintDecorator(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisDecorator)"
                 );
  }
  ZVar8 = 0x80100004;
  switch(decorator) {
  case ZYDIS_DECORATOR_MASK:
    if ((context->instruction->avx).mask.reg == ZYDIS_REGISTER_K0) break;
    if (buffer->is_token_list == '\0') {
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
        __assert_fail("!destination->vector.allocator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xeb,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      ZVar5 = (buffer->string).vector.size;
      if (ZVar5 == 0) {
        __assert_fail("destination->vector.size && source->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xec,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      uVar6 = (buffer->string).vector.capacity;
      ZVar8 = 0x80100009;
      if (ZVar5 + 2 <= uVar6) {
        pvVar7 = (buffer->string).vector.data;
        *(undefined1 *)((long)pvVar7 + ZVar5 + 1) = 0;
        *(undefined2 *)((long)pvVar7 + (ZVar5 - 1)) = 0x7b20;
        ZVar9 = (buffer->string).vector.size;
        pvVar7 = (buffer->string).vector.data;
        (buffer->string).vector.size = ZVar9 + 2;
        ZVar8 = 0x100000;
        if (*(char *)((long)pvVar7 + ZVar9 + 1) != '\0') {
          __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0xf7,
                        "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
          ;
        }
      }
      if (uVar6 < ZVar5 + 2) {
        return ZVar8;
      }
      ZVar8 = (*formatter->func_print_register)
                        (formatter,buffer,context,(context->instruction->avx).mask.reg);
      if ((int)ZVar8 < 0) {
        return ZVar8;
      }
LAB_0011a8e3:
      ZVar8 = ZydisStringAppendShort(&buffer->string,&STR_DECO_END);
    }
    else {
      ZVar5 = (buffer->string).vector.size;
      if (0xfe < ZVar5 - 1) {
LAB_0011ae0b:
        __assert_fail("(len > 0) && (len < 256)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                      ,0xe7,
                      "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                     );
      }
      uVar6 = buffer->capacity;
      ZVar8 = 0x80100009;
      if (ZVar5 + 8 < uVar6) {
        pvVar7 = (buffer->string).vector.data;
        *(char *)((long)pvVar7 + -1) = (char)ZVar5;
        *(undefined8 *)((long)pvVar7 + ZVar5) = 0x7b000300200201;
        ZVar9 = buffer->capacity - (ZVar5 + 6);
        buffer->capacity = ZVar9;
        ppvVar1 = &(buffer->string).vector.data;
        *ppvVar1 = (void *)((long)*ppvVar1 + ZVar5 + 6);
        (buffer->string).vector.size = 2;
        if (0xfe < ZVar9) {
          ZVar9 = 0xff;
        }
        (buffer->string).vector.capacity = ZVar9;
        ZVar8 = 0x100000;
      }
      if (uVar6 <= ZVar5 + 8) {
        return ZVar8;
      }
      ZVar8 = (*formatter->func_print_register)
                        (formatter,buffer,context,(context->instruction->avx).mask.reg);
      if ((int)ZVar8 < 0) {
        return ZVar8;
      }
      if (buffer->is_token_list == '\0') goto LAB_0011a8e3;
      ZVar8 = ZydisFormatterBufferAppendPredefined
                        (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_END);
    }
    if ((int)ZVar8 < 0) {
      return ZVar8;
    }
    ZVar4 = (context->instruction->avx).mask.mode;
    if (((ZVar4 != ZYDIS_MASK_MODE_CONTROL_ZEROING) && (ZVar4 != ZYDIS_MASK_MODE_REQUIRED_BITS)) ||
       ((context->instruction->raw).field_3.xop.offset == '\0')) break;
    if (buffer->is_token_list == '\0') {
      ZVar8 = ZydisStringAppendShortCase(&buffer->string,&STR_DECO_ZERO,formatter->case_decorators);
    }
    else {
      ZVar8 = ZydisFormatterBufferAppendPredefined
                        (buffer,(ZydisPredefinedToken *)&TOK_DATA_DECO_ZERO);
    }
    goto joined_r0x0011ad96;
  case ZYDIS_DECORATOR_BC:
    if ((context->instruction->avx).broadcast.is_static == '\0') {
      switch((context->instruction->avx).broadcast.mode) {
      case ZYDIS_BROADCAST_MODE_INVALID:
        goto switchD_0011a773_caseD_0;
      case ZYDIS_BROADCAST_MODE_1_TO_2:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_1TO2;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_1TO2;
        break;
      case ZYDIS_BROADCAST_MODE_1_TO_4:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_1TO4;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_1TO4;
        break;
      case ZYDIS_BROADCAST_MODE_1_TO_8:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_1TO8;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_1TO8;
        break;
      case ZYDIS_BROADCAST_MODE_1_TO_16:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_1TO16;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_1TO16;
        break;
      case ZYDIS_BROADCAST_MODE_1_TO_32:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_1TO32;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_1TO32;
        break;
      case ZYDIS_BROADCAST_MODE_1_TO_64:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_1TO64;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_1TO64;
        break;
      default:
        goto switchD_0011a5a8_default;
      case ZYDIS_BROADCAST_MODE_4_TO_8:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_4TO8;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_4TO8;
        break;
      case ZYDIS_BROADCAST_MODE_4_TO_16:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_4TO16;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_4TO16;
        break;
      case ZYDIS_BROADCAST_MODE_8_TO_16:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_8TO16;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_8TO16;
      }
      goto LAB_0011ac6e;
    }
    break;
  case ZYDIS_DECORATOR_RC:
    ZVar3 = (context->instruction->avx).rounding.mode;
    if ((context->instruction->avx).has_sae == '\0') {
      switch(ZVar3) {
      case ZYDIS_ROUNDING_MODE_INVALID:
        goto switchD_0011a773_caseD_0;
      case ZYDIS_ROUNDING_MODE_RN:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RN;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_RN;
        break;
      case ZYDIS_ROUNDING_MODE_RD:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RD;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_RD;
        break;
      case ZYDIS_ROUNDING_MODE_REQUIRED_BITS:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RU;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_RU;
        break;
      case ZYDIS_ROUNDING_MODE_MAX_VALUE:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RZ;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_RZ;
        break;
      default:
        goto switchD_0011a5a8_default;
      }
    }
    else {
      switch(ZVar3) {
      case ZYDIS_ROUNDING_MODE_INVALID:
        goto switchD_0011a773_caseD_0;
      case ZYDIS_ROUNDING_MODE_RN:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RN_SAE;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_RN_SAE;
        break;
      case ZYDIS_ROUNDING_MODE_RD:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RD_SAE;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_RD_SAE;
        break;
      case ZYDIS_ROUNDING_MODE_REQUIRED_BITS:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RU_SAE;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_RU_SAE;
        break;
      case ZYDIS_ROUNDING_MODE_MAX_VALUE:
        if (buffer->is_token_list == '\0') {
          letter_case = formatter->case_decorators;
          source = &STR_DECO_RZ_SAE;
          goto LAB_0011ad8c;
        }
        data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_RZ_SAE;
        break;
      default:
        goto switchD_0011a5a8_default;
      }
    }
    goto LAB_0011ac6e;
  case ZYDIS_DECORATOR_SAE:
    if (((context->instruction->avx).has_sae != '\0') &&
       ((context->instruction->avx).rounding.mode == ZYDIS_ROUNDING_MODE_INVALID)) {
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_SAE;
        goto LAB_0011ad8c;
      }
      data = &TOK_DATA_DECO_SAE;
      goto LAB_0011ac6e;
    }
    break;
  case ZYDIS_DECORATOR_SWIZZLE:
    switch((context->instruction->avx).swizzle.mode) {
    case ZYDIS_SWIZZLE_MODE_INVALID:
    case ZYDIS_SWIZZLE_MODE_DCBA:
      goto switchD_0011a773_caseD_0;
    case ZYDIS_SWIZZLE_MODE_CDAB:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_CDAB;
LAB_0011ad8c:
        ZVar8 = ZydisStringAppendShortCase(&buffer->string,source,letter_case);
        goto joined_r0x0011ad96;
      }
      data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_CDAB;
      break;
    case ZYDIS_SWIZZLE_MODE_BADC:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_BADC;
        goto LAB_0011ad8c;
      }
      data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_BADC;
      break;
    case ZYDIS_SWIZZLE_MODE_DACB:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_DACB;
        goto LAB_0011ad8c;
      }
      data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_DACB;
      break;
    case ZYDIS_SWIZZLE_MODE_AAAA:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_AAAA;
        goto LAB_0011ad8c;
      }
      data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_AAAA;
      break;
    case ZYDIS_SWIZZLE_MODE_BBBB:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_BBBB;
        goto LAB_0011ad8c;
      }
      data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_BBBB;
      break;
    case ZYDIS_SWIZZLE_MODE_CCCC:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_CCCC;
        goto LAB_0011ad8c;
      }
      data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_CCCC;
      break;
    case ZYDIS_SWIZZLE_MODE_DDDD:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_DDDD;
        goto LAB_0011ad8c;
      }
      data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_DDDD;
      break;
    default:
      goto switchD_0011a5a8_default;
    }
    goto LAB_0011ac6e;
  case ZYDIS_DECORATOR_CONVERSION:
    switch((context->instruction->avx).conversion.mode) {
    case ZYDIS_CONVERSION_MODE_INVALID:
      goto switchD_0011a773_caseD_0;
    case ZYDIS_CONVERSION_MODE_FLOAT16:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_FLOAT16;
        goto LAB_0011ad8c;
      }
      data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_FLOAT16;
      break;
    case ZYDIS_CONVERSION_MODE_SINT8:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_SINT8;
        goto LAB_0011ad8c;
      }
      data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_SINT8;
      break;
    case ZYDIS_CONVERSION_MODE_REQUIRED_BITS:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_UINT8;
        goto LAB_0011ad8c;
      }
      data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_UINT8;
      break;
    case ZYDIS_CONVERSION_MODE_SINT16:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_SINT16;
        goto LAB_0011ad8c;
      }
      data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_SINT16;
      break;
    case ZYDIS_CONVERSION_MODE_MAX_VALUE:
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_UINT16;
        goto LAB_0011ad8c;
      }
      data = (ZydisPredefinedTokenDECO_SAE_ *)&TOK_DATA_DECO_UINT16;
      break;
    default:
      return 0x80100004;
    }
LAB_0011ac6e:
    ZVar8 = ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)data);
joined_r0x0011ad96:
    if ((int)ZVar8 < 0) {
      return ZVar8;
    }
    break;
  case ZYDIS_DECORATOR_EH:
    if ((context->instruction->avx).has_eviction_hint != '\0') {
      if (buffer->is_token_list == '\0') {
        letter_case = formatter->case_decorators;
        source = &STR_DECO_EH;
        goto LAB_0011ad8c;
      }
      ZVar5 = (buffer->string).vector.size;
      if (0xfe < ZVar5 - 1) goto LAB_0011ae0b;
      uVar6 = buffer->capacity;
      ZVar8 = 0x80100009;
      if (ZVar5 + 0x11 < uVar6) {
        pvVar7 = (buffer->string).vector.data;
        *(char *)((long)pvVar7 + -1) = (char)ZVar5;
        pZVar2 = (ZyanU8 *)((long)pvVar7 + ZVar5);
        builtin_memcpy(pZVar2,"\x01\x02 ",4);
        builtin_memcpy(pZVar2 + 4,"\x03\x02{",4);
        builtin_memcpy(pZVar2 + 8,"\r\x03eh",5);
        pZVar2[0xd] = '\x04';
        pZVar2[0xe] = '\0';
        pZVar2[0xf] = '}';
        *(undefined1 *)((long)pvVar7 + ZVar5 + 0x10) = 0;
        ZVar9 = buffer->capacity - (ZVar5 + 0xf);
        buffer->capacity = ZVar9;
        ppvVar1 = &(buffer->string).vector.data;
        *ppvVar1 = (void *)((long)*ppvVar1 + ZVar5 + 0xf);
        (buffer->string).vector.size = 2;
        if (0xfe < ZVar9) {
          ZVar9 = 0xff;
        }
        (buffer->string).vector.capacity = ZVar9;
        ZVar8 = 0x100000;
      }
      if (uVar6 <= ZVar5 + 0x11) {
        return ZVar8;
      }
    }
    break;
  default:
    goto switchD_0011a5a8_default;
  }
switchD_0011a773_caseD_0:
  ZVar8 = 0x100000;
switchD_0011a5a8_default:
  return ZVar8;
}

Assistant:

ZyanStatus ZydisFormatterBasePrintDecorator(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context, ZydisDecorator decorator)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

#if defined(ZYDIS_DISABLE_AVX512) && defined(ZYDIS_DISABLE_KNC)
    ZYAN_UNUSED(formatter);
    ZYAN_UNUSED(buffer);
    ZYAN_UNUSED(context);
#endif

    switch (decorator)
    {
    case ZYDIS_DECORATOR_MASK:
    {
#if !defined(ZYDIS_DISABLE_AVX512) || !defined(ZYDIS_DISABLE_KNC)
        if (context->instruction->avx.mask.reg != ZYDIS_REGISTER_K0)
        {
            if (buffer->is_token_list)
            {
                ZYDIS_BUFFER_APPEND(buffer, DECO_BEGIN);
                ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                    context->instruction->avx.mask.reg));
                ZYDIS_BUFFER_APPEND(buffer, DECO_END);
            } else
            {
                ZYAN_CHECK(ZydisStringAppendShort(&buffer->string, &STR_DECO_BEGIN));
                ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                    context->instruction->avx.mask.reg));
                ZYAN_CHECK(ZydisStringAppendShort(&buffer->string, &STR_DECO_END));
            }

            // Only print the zeroing decorator, if the instruction is not a "zeroing masking only"
            // instruction (e.g. `vcmpsd`)
            if ((context->instruction->avx.mask.mode == ZYDIS_MASK_MODE_ZEROING ||
                 context->instruction->avx.mask.mode == ZYDIS_MASK_MODE_CONTROL_ZEROING) &&
                (context->instruction->raw.evex.z))
            {
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_ZERO, formatter->case_decorators);
            }
        }
#endif
        break;
    }
    case ZYDIS_DECORATOR_BC:
#if !defined(ZYDIS_DISABLE_AVX512)
        if (!context->instruction->avx.broadcast.is_static)
        {
            switch (context->instruction->avx.broadcast.mode)
            {
            case ZYDIS_BROADCAST_MODE_INVALID:
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_2:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO2, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_4:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO4, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_8:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO8, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_16:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO16, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_32:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO32, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_1_TO_64:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_1TO64, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_4_TO_8:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_4TO8, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_4_TO_16:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_4TO16, formatter->case_decorators);
                break;
            case ZYDIS_BROADCAST_MODE_8_TO_16:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_8TO16, formatter->case_decorators);
                break;
            default:
                return ZYAN_STATUS_INVALID_ARGUMENT;
            }
        }
#endif
        break;
    case ZYDIS_DECORATOR_RC:
#if !defined(ZYDIS_DISABLE_AVX512)
        if (context->instruction->avx.has_sae)
        {
            switch (context->instruction->avx.rounding.mode)
            {
            case ZYDIS_ROUNDING_MODE_INVALID:
                break;
            case ZYDIS_ROUNDING_MODE_RN:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RN_SAE, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RD:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RD_SAE, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RU:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RU_SAE, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RZ:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RZ_SAE, formatter->case_decorators);
                break;
            default:
                return ZYAN_STATUS_INVALID_ARGUMENT;
            }
        } else
        {
            switch (context->instruction->avx.rounding.mode)
            {
            case ZYDIS_ROUNDING_MODE_INVALID:
                break;
            case ZYDIS_ROUNDING_MODE_RN:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RN, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RD:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RD, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RU:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RU, formatter->case_decorators);
                break;
            case ZYDIS_ROUNDING_MODE_RZ:
                ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_RZ, formatter->case_decorators);
                break;
            default:
                return ZYAN_STATUS_INVALID_ARGUMENT;
            }
        }
#endif
        break;
    case ZYDIS_DECORATOR_SAE:
#if !defined(ZYDIS_DISABLE_AVX512)
        if (context->instruction->avx.has_sae && !context->instruction->avx.rounding.mode)
        {
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_SAE, formatter->case_decorators);
        }
#endif
        break;
    case ZYDIS_DECORATOR_SWIZZLE:
#if !defined(ZYDIS_DISABLE_KNC)
        switch (context->instruction->avx.swizzle.mode)
        {
        case ZYDIS_SWIZZLE_MODE_INVALID:
        case ZYDIS_SWIZZLE_MODE_DCBA:
            // Nothing to do here
            break;
        case ZYDIS_SWIZZLE_MODE_CDAB:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_CDAB, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_BADC:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_BADC, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_DACB:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_DACB, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_AAAA:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_AAAA, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_BBBB:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_BBBB, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_CCCC:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_CCCC, formatter->case_decorators);
            break;
        case ZYDIS_SWIZZLE_MODE_DDDD:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_DDDD, formatter->case_decorators);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
#endif
        break;
    case ZYDIS_DECORATOR_CONVERSION:
#if !defined(ZYDIS_DISABLE_KNC)
        switch (context->instruction->avx.conversion.mode)
        {
        case ZYDIS_CONVERSION_MODE_INVALID:
            break;
        case ZYDIS_CONVERSION_MODE_FLOAT16:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_FLOAT16, formatter->case_decorators);
            break;
        case ZYDIS_CONVERSION_MODE_SINT8:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_SINT8, formatter->case_decorators);
            break;
        case ZYDIS_CONVERSION_MODE_UINT8:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_UINT8, formatter->case_decorators);
            break;
        case ZYDIS_CONVERSION_MODE_SINT16:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_SINT16, formatter->case_decorators);
            break;
        case ZYDIS_CONVERSION_MODE_UINT16:
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_UINT16, formatter->case_decorators);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
#endif
        break;
    case ZYDIS_DECORATOR_EH:
#if !defined(ZYDIS_DISABLE_KNC)
        if (context->instruction->avx.has_eviction_hint)
        {
            ZYDIS_BUFFER_APPEND_CASE(buffer, DECO_EH, formatter->case_decorators);
        }
#endif
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}